

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_index.h
# Opt level: O0

long __thiscall BufferIndex<double,_long>::find(BufferIndex<double,_long> *this,double key)

{
  bool bVar1;
  long lVar2;
  BufferIndex<double,_long> *in_RDI;
  double in_XMM0_Qa;
  btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
  *unaff_retaddr;
  Buffer *in_stack_ffffffffffffffc8;
  double in_stack_ffffffffffffffd0;
  BufferNode<double,_long> *in_stack_ffffffffffffffd8;
  BufferIndex<double,_long> *this_00;
  key_type *in_stack_fffffffffffffff8;
  
  this_00 = in_RDI;
  bVar1 = less_than(in_RDI,in_XMM0_Qa,in_RDI->min_key);
  if ((!bVar1) && (bVar1 = greater_than(in_RDI,in_XMM0_Qa,in_RDI->max_key), !bVar1)) {
    stx::
    btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
    ::upper_bound(unaff_retaddr,in_stack_fffffffffffffff8);
    stx::
    btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
    ::const_iterator::operator--((const_iterator *)&stack0xffffffffffffffc8);
    stx::
    btree<double,_BufferNode<double,_long>_*,_std::pair<double,_BufferNode<double,_long>_*>,_std::less<double>,_stx::btree_default_map_traits<double,_BufferNode<double,_long>_*>,_false,_std::allocator<std::pair<double,_BufferNode<double,_long>_*>_>,_false>
    ::const_iterator::operator->((const_iterator *)this_00);
    lVar2 = BufferNode<double,_long>::find(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    return lVar2;
  }
  bVar1 = less_than(in_RDI,in_XMM0_Qa,in_RDI->min_key);
  if (bVar1) {
    lVar2 = Buffer::find(in_stack_ffffffffffffffc8,(double)in_RDI);
  }
  else {
    lVar2 = Buffer::find(in_stack_ffffffffffffffc8,(double)in_RDI);
  }
  return lVar2;
}

Assistant:

P find(K key) const {
        if (!less_than(key, min_key) && !greater_than(key, max_key)) {
            return (--btree.upper_bound(key))->second->find(key);
        }
        else if (less_than(key, min_key)) {
            return left_buffer.find(key);
        }
        else {
            return right_buffer.find(key);
        }
    }